

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlAddEncodingAlias(char *name,char *alias)

{
  int iVar1;
  char *pcVar2;
  char local_88 [8];
  char upper [100];
  int i;
  char *alias_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (alias == (char *)0x0)) {
    name_local._4_4_ = -1;
  }
  else {
    upper[0x5c] = '\0';
    upper[0x5d] = '\0';
    upper[0x5e] = '\0';
    upper[0x5f] = '\0';
    unique0x100001a3 = alias;
    for (; (int)upper._92_4_ < 99; upper._92_4_ = upper._92_4_ + 1) {
      iVar1 = toupper((int)stack0xffffffffffffffe0[(int)upper._92_4_]);
      local_88[(int)upper._92_4_] = (char)iVar1;
      if (local_88[(int)upper._92_4_] == '\0') break;
    }
    local_88[(int)upper._92_4_] = '\0';
    if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0) {
      xmlCharEncodingAliasesNb = 0;
      xmlCharEncodingAliasesMax = 0x14;
      xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)(*xmlMalloc)(0x140);
      if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0) {
        return -1;
      }
    }
    else if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
      xmlCharEncodingAliasesMax = xmlCharEncodingAliasesMax << 1;
      xmlCharEncodingAliases =
           (xmlCharEncodingAliasPtr)
           (*xmlRealloc)(xmlCharEncodingAliases,(long)xmlCharEncodingAliasesMax << 4);
    }
    upper[0x5c] = '\0';
    upper[0x5d] = '\0';
    upper[0x5e] = '\0';
    upper[0x5f] = '\0';
    for (; (int)upper._92_4_ < xmlCharEncodingAliasesNb; upper._92_4_ = upper._92_4_ + 1) {
      iVar1 = strcmp(xmlCharEncodingAliases[(int)upper._92_4_].alias,local_88);
      if (iVar1 == 0) {
        (*xmlFree)(xmlCharEncodingAliases[(int)upper._92_4_].name);
        pcVar2 = (*xmlMemStrdup)(name);
        xmlCharEncodingAliases[(int)upper._92_4_].name = pcVar2;
        return 0;
      }
    }
    pcVar2 = (*xmlMemStrdup)(name);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = pcVar2;
    pcVar2 = (*xmlMemStrdup)(local_88);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = pcVar2;
    xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = toupper(alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliases == NULL) {
	xmlCharEncodingAliasesNb = 0;
	xmlCharEncodingAliasesMax = 20;
	xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)
	      xmlMalloc(xmlCharEncodingAliasesMax * sizeof(xmlCharEncodingAlias));
	if (xmlCharEncodingAliases == NULL)
	    return(-1);
    } else if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
	xmlCharEncodingAliasesMax *= 2;
	xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)
	      xmlRealloc(xmlCharEncodingAliases,
		         xmlCharEncodingAliasesMax * sizeof(xmlCharEncodingAlias));
    }
    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = xmlMemStrdup(name);
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = xmlMemStrdup(name);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = xmlMemStrdup(upper);
    xmlCharEncodingAliasesNb++;
    return(0);
}